

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naming.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::rust::MultiCasePrefixStripper::MultiCasePrefixStripper
          (MultiCasePrefixStripper *this,string_view prefix)

{
  char *in_RCX;
  string_view input;
  string_view input_00;
  allocator<char> local_29;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_str = prefix._M_str;
  local_28._M_len = prefix._M_len;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)this,&local_28,&local_29);
  input._M_str = in_RCX;
  input._M_len = (size_t)local_28._M_str;
  ScreamingSnakeToUpperCamelCase_abi_cxx11_
            ((this->prefixes_)._M_elems + 1,(rust *)local_28._M_len,input);
  input_00._M_str = in_RCX;
  input_00._M_len = (size_t)local_28._M_str;
  CamelToSnakeCase_abi_cxx11_((this->prefixes_)._M_elems + 2,(rust *)local_28._M_len,input_00);
  return;
}

Assistant:

MultiCasePrefixStripper::MultiCasePrefixStripper(absl::string_view prefix)
    : prefixes_{
          std::string(prefix),
          ScreamingSnakeToUpperCamelCase(prefix),
          CamelToSnakeCase(prefix),
      } {}